

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O2

SeedType cppqc::detail::resolveSeed(SeedType originalSeed)

{
  char *pcVar1;
  time_t tVar2;
  allocator aaStack_1b8 [32];
  ostringstream err;
  
  if (originalSeed == 0xffffffff) {
    pcVar1 = getenv("CPPQUICKCHECK_SEED");
    if (pcVar1 == (char *)0x0) {
      tVar2 = time((time_t *)0x0);
      originalSeed = (SeedType)tVar2;
    }
    else {
      std::__cxx11::string::string((string *)&err,pcVar1,aaStack_1b8);
      originalSeed = std::__cxx11::stoi((string *)&err,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&err);
    }
  }
  return originalSeed;
}

Assistant:

inline SeedType resolveSeed(SeedType originalSeed = USE_DEFAULT_SEED) {
  if (originalSeed == USE_DEFAULT_SEED) {
    const char* seed_from_env = std::getenv(CPPQUICKCHECK_SEED_ENV);
    if (seed_from_env != nullptr) {
      try {
        return static_cast<uint32_t>(std::stoi(seed_from_env));
      } catch (std::invalid_argument&) {
        std::ostringstream err;
        err << "Failed to parse seed in environment variable "
            << CPPQUICKCHECK_SEED_ENV << ": Got <" << seed_from_env
            << ">, but expected an integer between "
            << "0 and " << (USE_DEFAULT_SEED - 1)
            << ". To use a random seed instead, "
               "unset the environment variable.";
        throw std::invalid_argument{err.str()};
      }
    } else {
      return static_cast<SeedType>(std::time(0));
    }
  } else {
    return originalSeed;
  }
}